

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O2

uint8_t FACT_INTERNAL_CreateSound(FACTCue *cue,uint16_t fadeInMS)

{
  uint32_t *puVar1;
  FACTInstanceRPCData *pFVar2;
  byte *pbVar3;
  byte bVar4;
  ushort uVar5;
  FACTAudioEngine *pFVar6;
  FACTAudioCategory *pFVar7;
  FACTEventInstance *pFVar8;
  char *pcVar9;
  LinkedList *pLVar10;
  FACTSound *pFVar11;
  double dVar12;
  byte bVar13;
  uint32_t uVar14;
  int iVar15;
  int iVar16;
  FACTSoundBank *pFVar17;
  FACTSoundInstance *pFVar18;
  FACTTrackInstance *pFVar19;
  FACTEventInstance *pFVar20;
  FACTRPC *pFVar21;
  uint16_t uVar22;
  ulong uVar23;
  ulong uVar24;
  FACTCue *pFVar25;
  FACTVariationTable *pFVar26;
  ulong uVar27;
  long lVar28;
  FACTCue *pCue;
  long lVar29;
  FACTSound *pFVar30;
  LinkedList **ppLVar31;
  FACTEvent *pFVar32;
  FACTWaveBank *pWaveBank;
  float fVar33;
  float next;
  ulong local_48;
  FACTCue *local_40;
  ulong local_38;
  
  pFVar30 = (FACTSound *)(cue->field_7).variation;
  if ((cue->data->flags & 4) == 0) {
    if (pFVar30->flags == '\x03') {
      pFVar6 = cue->parentBank->parentEngine;
      uVar22 = pFVar30->category;
      if ((pFVar6->variables[(short)uVar22].accessibility & 4) == 0) {
        FACTAudioEngine_GetGlobalVariable(pFVar6,uVar22,&next);
      }
      else {
        FACTCue_GetVariable(cue,uVar22,&next);
      }
      pFVar26 = (cue->field_7).variation;
      lVar28 = 8;
      uVar24 = 0;
      while( true ) {
        if (pFVar26->entryCount == uVar24) {
          return '\x01';
        }
        if ((next <= *(float *)((long)&pFVar26->entries->field_0 + lVar28)) &&
           (*(float *)((long)pFVar26->entries + lVar28 + -4) <= next)) break;
        uVar24 = uVar24 + 1;
        lVar28 = lVar28 + 0x10;
      }
      if (pFVar26->entryCount == uVar24) {
        return '\x01';
      }
    }
    else {
      fVar33 = 0.0;
      for (lVar28 = 0; (ulong)*(ushort *)((long)&pFVar30->volume + 2) * 0x10 != lVar28;
          lVar28 = lVar28 + 0x10) {
        fVar33 = fVar33 + (*(float *)(*(long *)&pFVar30->pitch + 8 + lVar28) -
                          *(float *)(*(long *)&pFVar30->pitch + 4 + lVar28));
      }
      local_48 = CONCAT44(local_48._4_4_,fVar33);
      dVar12 = stb_frand();
      next = (float)dVar12 * (float)local_48;
      pFVar26 = (cue->field_7).variation;
      lVar28 = (ulong)pFVar26->entryCount * 0x10 + -8;
      uVar27 = (ulong)pFVar26->entryCount;
      fVar33 = (float)local_48;
      do {
        uVar24 = uVar27;
        if ((long)uVar24 < 2) break;
        fVar33 = fVar33 - (*(float *)((long)&pFVar26->entries->field_0 + lVar28) -
                          *(float *)((long)pFVar26->entries + lVar28 + -4));
        lVar28 = lVar28 + -0x10;
        uVar27 = uVar24 - 1;
      } while (next <= fVar33);
      uVar24 = uVar24 - 1;
    }
    pFVar17 = cue->parentBank;
    iVar15 = (int)uVar24;
    if (pFVar26->isComplex == '\0') {
      pcVar9 = pFVar17->wavebankNames[pFVar26->entries[iVar15].field_0.simple.wavebank];
      ppLVar31 = &pFVar17->parentEngine->wbList;
      pWaveBank = (FACTWaveBank *)0x0;
      do {
        pLVar10 = *ppLVar31;
        if (pLVar10 == (LinkedList *)0x0) break;
        pWaveBank = (FACTWaveBank *)pLVar10->entry;
        iVar16 = SDL_strcmp(pcVar9,pWaveBank->name);
        ppLVar31 = &pLVar10->next;
      } while (iVar16 != 0);
      FACTWaveBank_Prepare
                (pWaveBank,((cue->field_7).variation)->entries[iVar15].field_0.simple.track,0,0,'\0'
                 ,&cue->simpleWave);
      cue->simpleWave->parentCue = cue;
      return '\x01';
    }
    lVar28 = 0x28;
    lVar29 = 0;
    do {
      if ((ulong)pFVar17->soundCount * 0x28 + lVar28 == 0x28) {
        return '\x01';
      }
      lVar28 = lVar28 + -0x28;
      puVar1 = (uint32_t *)((long)pFVar17->soundCodes + lVar29);
      lVar29 = lVar29 + 4;
    } while (pFVar26->entries[iVar15].field_0.soundCode != *puVar1);
    pFVar30 = (FACTSound *)((long)pFVar17->sounds - lVar28);
  }
  if (pFVar30 == (FACTSound *)0x0) {
    return '\x01';
  }
  uVar5 = pFVar30->category;
  uVar24 = (ulong)uVar5;
  pFVar17 = cue->parentBank;
  if (uVar24 == 0xffff) goto LAB_0010d73c;
  pFVar7 = pFVar17->parentEngine->categories;
  if ((pFVar7[uVar24].instanceCount < pFVar7[uVar24].instanceLimit) ||
     (4 < pFVar7[uVar24].maxInstanceBehavior)) goto LAB_0010d734;
  pFVar25 = pFVar17->cueList;
  switch(pFVar7[uVar24].maxInstanceBehavior) {
  case '\0':
    cue->state = cue->state & 0xffffff87 | 0x20;
    return '\0';
  case '\x01':
    for (; pFVar25 != (FACTCue *)0x0; pFVar25 = pFVar25->next) {
      if (((pFVar25 != cue) &&
          (pFVar18 = pFVar25->playingSound, pFVar18 != (FACTSoundInstance *)0x0)) &&
         ((pFVar18->sound->category == uVar5 && ((pFVar25->state & 0x30) == 0)))) goto LAB_0010dcb3;
    }
    break;
  case '\x02':
    for (; pFVar25 != (FACTCue *)0x0; pFVar25 = pFVar25->next) {
      if ((((pFVar25 != cue) &&
           (pFVar18 = pFVar25->playingSound, pFVar18 != (FACTSoundInstance *)0x0)) &&
          (pFVar18->sound->category == uVar5)) && ((pFVar25->state & 0x30) == 0)) goto LAB_0010dcb3;
    }
    break;
  case '\x03':
    pCue = (FACTCue *)0x0;
    for (; pFVar25 != (FACTCue *)0x0; pFVar25 = pFVar25->next) {
      if (((pFVar25 != cue) && (pFVar25->playingSound != (FACTSoundInstance *)0x0)) &&
         ((pFVar25->playingSound->sound->category == uVar5 && ((pFVar25->state & 0x30) == 0)))) {
        pCue = pFVar25;
      }
    }
    goto LAB_0010dc90;
  case '\x04':
    bVar13 = 0xff;
    pCue = (FACTCue *)0x0;
    for (; pFVar25 != (FACTCue *)0x0; pFVar25 = pFVar25->next) {
      if ((((pFVar25 != cue) && (pFVar25->playingSound != (FACTSoundInstance *)0x0)) &&
          (pFVar11 = pFVar25->playingSound->sound, pFVar11->category == uVar5)) &&
         ((bVar4 = pFVar11->priority, bVar4 < bVar13 && ((pFVar25->state & 0x30) == 0)))) {
        pCue = pFVar25;
        bVar13 = bVar4;
      }
    }
LAB_0010dc90:
    if (pCue != (FACTCue *)0x0) {
      pFVar18 = pCue->playingSound;
      fadeInMS = pFVar7[uVar24].fadeInMS;
      if (pFVar18 == (FACTSoundInstance *)0x0) {
        FACTCue_Stop(pCue,0);
      }
      else {
LAB_0010dcb8:
        FACT_INTERNAL_BeginFadeOut(pFVar18,pFVar7[uVar24].fadeOutMS);
      }
    }
  }
LAB_0010d734:
  pFVar7[uVar24].instanceCount = pFVar7[uVar24].instanceCount + '\x01';
  pFVar17 = cue->parentBank;
LAB_0010d73c:
  pFVar18 = (FACTSoundInstance *)(*pFVar17->parentEngine->pMalloc)(0x38);
  pFVar18->parentCue = cue;
  pFVar18->sound = pFVar30;
  (pFVar18->rpcData).rpcFilterQFactor = 1.0;
  (pFVar18->rpcData).rpcVolume = 0.0;
  (pFVar18->rpcData).rpcPitch = 0.0;
  (pFVar18->rpcData).rpcReverbSend = 0.0;
  (pFVar18->rpcData).rpcFilterFreq = 1.0;
  pFVar18->fadeType = fadeInMS != 0;
  if (fadeInMS == 0) {
    uVar14 = 0;
  }
  else {
    uVar14 = FAudio_timems();
    pFVar30 = pFVar18->sound;
  }
  pFVar18->fadeStart = uVar14;
  pFVar18->fadeTarget = fadeInMS;
  pFVar19 = (FACTTrackInstance *)
            (*cue->parentBank->parentEngine->pMalloc)((ulong)pFVar30->trackCount * 0x68);
  pFVar18->tracks = pFVar19;
  pFVar30 = pFVar18->sound;
  uVar24 = 0;
  local_40 = cue;
  do {
    pFVar25 = local_40;
    uVar27 = (ulong)pFVar30->trackCount;
    if (uVar27 <= uVar24) {
      local_40->maxRpcReleaseTime = 0;
      uVar24 = 0;
      while (uVar24 < uVar27) {
        local_48 = uVar24;
        for (uVar27 = 0; uVar27 < pFVar30->tracks[uVar24].rpcCodeCount; uVar27 = uVar27 + 1) {
          pFVar6 = pFVar18->parentCue->parentBank->parentEngine;
          pFVar21 = FACT_INTERNAL_GetRPC(pFVar6,pFVar30->tracks[uVar24].rpcCodes[uVar27]);
          if ((((pFVar21->parameter == 0) &&
               ((pFVar25->parentBank->parentEngine->variables[pFVar21->variable].accessibility & 4)
                != 0)) &&
              (iVar15 = SDL_strcmp(pFVar6->variableNames[pFVar21->variable],"ReleaseTime"),
              iVar15 == 0)) &&
             (fVar33 = pFVar21->points[(ulong)pFVar21->pointCount - 1].x,
             (float)pFVar25->maxRpcReleaseTime < fVar33)) {
            pFVar25->maxRpcReleaseTime = (uint32_t)(long)fVar33;
          }
          pFVar30 = pFVar18->sound;
        }
        uVar27 = (ulong)pFVar30->trackCount;
        uVar24 = local_48 + 1;
      }
      pFVar25->playingSound = pFVar18;
      return '\x01';
    }
    pFVar19 = pFVar18->tracks;
    pFVar2 = &pFVar19[uVar24].rpcData;
    pFVar2->rpcVolume = 0.0;
    pFVar2->rpcPitch = 0.0;
    pFVar2->rpcReverbSend = 0.0;
    pFVar2->rpcFilterFreq = 1.0;
    pFVar19[uVar24].evtVolume = 0.0;
    *(undefined8 *)&pFVar19[uVar24].rpcData.rpcFilterQFactor = 0x3f800000;
    pFVar19[uVar24].activeWave.wave = (FACTWave *)0x0;
    pFVar19[uVar24].activeWave.baseVolume = 0.0;
    pFVar19[uVar24].activeWave.basePitch = 0;
    pFVar19[uVar24].activeWave.baseQFactor = 1.0;
    pFVar19[uVar24].activeWave.baseFrequency = 1.0;
    pFVar19[uVar24].upcomingWave.wave = (FACTWave *)0x0;
    pFVar19[uVar24].upcomingWave.baseVolume = 0.0;
    pFVar19[uVar24].upcomingWave.basePitch = 0;
    pFVar19[uVar24].upcomingWave.baseQFactor = 1.0;
    pFVar19[uVar24].upcomingWave.baseFrequency = 1.0;
    local_38 = uVar24;
    pFVar20 = (FACTEventInstance *)
              (*local_40->parentBank->parentEngine->pMalloc)
                        ((ulong)pFVar30->tracks[uVar24].eventCount * 0xc);
    pFVar18->tracks[uVar24].events = pFVar20;
    uVar27 = 0;
    while( true ) {
      pFVar30 = pFVar18->sound;
      if (pFVar30->tracks[uVar24].eventCount <= uVar27) break;
      pFVar32 = pFVar30->tracks[uVar24].events;
      pFVar20 = pFVar18->tracks[uVar24].events;
      pFVar20[uVar27].timestamp = (uint)pFVar32[uVar27].timestamp;
      pFVar20[uVar27].loopCount = 0;
      pFVar20[uVar27].finished = '\0';
      pFVar20[uVar27].field_3.value = 0.0;
      uVar5 = pFVar32[uVar27].type;
      if (uVar5 < 0x13) {
        if ((0x5aU >> (uVar5 & 0x1f) & 1) == 0) {
          if ((0x30000U >> (uVar5 & 0x1f) & 1) == 0) {
            if (uVar5 != 0x12) goto LAB_0010d9c6;
            pFVar19 = pFVar18->tracks;
            uVar22 = pFVar18->sound->tracks[uVar24].events[uVar27].field_3.wave.angle;
          }
          else {
            pFVar19 = pFVar18->tracks;
            uVar22 = pFVar18->sound->tracks[uVar24].events[uVar27].field_3.wave.position;
          }
          pFVar19[uVar24].events[uVar27].loopCount = uVar22;
        }
        else {
          pFVar32 = pFVar32 + uVar27;
          pFVar8 = pFVar18->tracks[uVar24].events;
          pFVar20 = pFVar8 + uVar27;
          pFVar8[uVar27].loopCount =
               (ushort)pFVar18->sound->tracks[uVar24].events[uVar27].field_3.wave.loopCount;
          uVar23 = 0;
          if (((pFVar32->field_3).wave.isComplex != '\0') &&
             ((undefined1  [72])((undefined1  [72])pFVar32->field_3 & (undefined1  [72])0xf) !=
              (undefined1  [72])0x0)) {
            fVar33 = 0.0;
            for (uVar23 = 0; *(ushort *)((long)&pFVar32->field_3 + 10) != uVar23;
                uVar23 = uVar23 + 1) {
              fVar33 = fVar33 + (float)*(byte *)(*(long *)((long)&pFVar32->field_3 + 0x20) + uVar23)
              ;
            }
            local_48 = CONCAT44(local_48._4_4_,fVar33);
            dVar12 = stb_frand();
            next = (float)dVar12 * (float)local_48;
            uVar23 = (ulong)*(ushort *)((long)&pFVar32->field_3 + 10);
            fVar33 = (float)local_48;
            do {
              if ((long)uVar23 < 1) goto LAB_0010d972;
              pbVar3 = (byte *)(*(long *)((long)&pFVar32->field_3 + 0x20) + -1 + uVar23);
              uVar23 = uVar23 - 1;
              fVar33 = fVar33 - (float)*pbVar3;
            } while (next <= fVar33);
          }
          (pFVar20->field_3).valuei = (uint32_t)uVar23;
LAB_0010d972:
          FACT_INTERNAL_GetNextWave
                    (local_40,pFVar18->sound,pFVar18->sound->tracks + uVar24,
                     pFVar18->tracks + uVar24,pFVar32,pFVar20);
          pFVar19 = pFVar18->tracks;
          pFVar19[uVar24].waveEvt = pFVar32;
          pFVar19[uVar24].waveEvtInst = pFVar20;
        }
      }
LAB_0010d9c6:
      uVar27 = uVar27 + 1;
    }
    uVar24 = local_38 + 1;
  } while( true );
LAB_0010dcb3:
  fadeInMS = pFVar7[uVar24].fadeInMS;
  goto LAB_0010dcb8;
}

Assistant:

uint8_t FACT_INTERNAL_CreateSound(FACTCue *cue, uint16_t fadeInMS)
{
	int32_t i, j, k;
	float max, next, weight;
	const char *wbName;
	FACTWaveBank *wb = NULL;
	LinkedList *list;
	FACTEvent *evt;
	FACTEventInstance *evtInst;
	FACTSound *baseSound = NULL;
	FACTSoundInstance *newSound;
	FACTRPC *rpc;
	float lastX;

	union
	{
		float maxf;
		uint8_t maxi;
	} limitmax;
	FACTCue *tmp, *wnr;
	uint16_t categoryIndex;
	FACTAudioCategory *category;

	if (cue->data->flags & 0x04)
	{
		/* Sound */
		baseSound = cue->sound;
	}
	else
	{
		/* Variation */
		if (cue->variation->flags == 3)
		{
			/* Interactive */
			if (cue->parentBank->parentEngine->variables[cue->variation->variable].accessibility & 0x04)
			{
				FACTCue_GetVariable(
					cue,
					cue->variation->variable,
					&next
				);
			}
			else
			{
				FACTAudioEngine_GetGlobalVariable(
					cue->parentBank->parentEngine,
					cue->variation->variable,
					&next
				);
			}
			for (i = 0; i < cue->variation->entryCount; i += 1)
			{
				if (	next <= cue->variation->entries[i].maxWeight &&
					next >= cue->variation->entries[i].minWeight	)
				{
					break;
				}
			}

			/* This should only happen when the user control
			 * variable is none of the sound probabilities, in
			 * which case we are just silent. But, we should still
			 * claim to be "playing" in the meantime.
			 */
			if (i == cue->variation->entryCount)
			{
				return 1;
			}
		}
		else
		{
			/* Random */
			max = 0.0f;
			for (i = 0; i < cue->variation->entryCount; i += 1)
			{
				max += (
					cue->variation->entries[i].maxWeight -
					cue->variation->entries[i].minWeight
				);
			}
			next = FACT_INTERNAL_rng() * max;

			/* Use > 0, not >= 0. If we hit 0, that's it! */
			for (i = cue->variation->entryCount - 1; i > 0; i -= 1)
			{
				weight = (
					cue->variation->entries[i].maxWeight -
					cue->variation->entries[i].minWeight
				);
				if (next > (max - weight))
				{
					break;
				}
				max -= weight;
			}
		}

		if (cue->variation->isComplex)
		{
			/* Grab the Sound via the code. FIXME: Do this at load time? */
			for (j = 0; j < cue->parentBank->soundCount; j += 1)
			{
				if (cue->variation->entries[i].soundCode == cue->parentBank->soundCodes[j])
				{
					baseSound = &cue->parentBank->sounds[j];
					break;
				}
			}
		}
		else
		{
			/* Pull in the WaveBank... */
			wbName = cue->parentBank->wavebankNames[
				cue->variation->entries[i].simple.wavebank
			];
			list = cue->parentBank->parentEngine->wbList;
			while (list != NULL)
			{
				wb = (FACTWaveBank*) list->entry;
				if (FAudio_strcmp(wbName, wb->name) == 0)
				{
					break;
				}
				list = list->next;
			}
			FAudio_assert(wb != NULL);

			/* Generate the wave... */
			FACTWaveBank_Prepare(
				wb,
				cue->variation->entries[i].simple.track,
				0,
				0,
				0,
				&cue->simpleWave
			);
			cue->simpleWave->parentCue = cue;
		}
	}

	/* Alloc SoundInstance variables */
	if (baseSound != NULL)
	{
		/* Category Instance Limits */
		categoryIndex = baseSound->category;
		if (categoryIndex != FACTCATEGORY_INVALID)
		{
			category = &cue->parentBank->parentEngine->categories[categoryIndex];
			if (category->instanceCount >= category->instanceLimit)
			{
				wnr = NULL;
				tmp = cue->parentBank->cueList;
				if (category->maxInstanceBehavior == 0) /* Fail */
				{
					cue->state |= FACT_STATE_STOPPED;
					cue->state &= ~(
						FACT_STATE_PLAYING |
						FACT_STATE_STOPPING |
						FACT_STATE_PAUSED
					);
					return 0;
				}
				else if (category->maxInstanceBehavior == 1) /* Queue */
				{
					/* FIXME: How is this different from Replace Oldest? */
					while (tmp != NULL)
					{
						if (	tmp != cue &&
							tmp->playingSound != NULL &&
							tmp->playingSound->sound->category == categoryIndex &&
							!(tmp->state & (FACT_STATE_STOPPING | FACT_STATE_STOPPED))	)
						{
							wnr = tmp;
							break;
						}
						tmp = tmp->next;
					}
				}
				else if (category->maxInstanceBehavior == 2) /* Replace Oldest */
				{
					while (tmp != NULL)
					{
						if (	tmp != cue &&
							tmp->playingSound != NULL &&
							tmp->playingSound->sound->category == categoryIndex &&
							!(tmp->state & (FACT_STATE_STOPPING | FACT_STATE_STOPPED))	)
						{
							wnr = tmp;
							break;
						}
						tmp = tmp->next;
					}
				}
				else if (category->maxInstanceBehavior == 3) /* Replace Quietest */
				{
					limitmax.maxf = FACTVOLUME_MAX;
					while (tmp != NULL)
					{
						if (	tmp != cue &&
							tmp->playingSound != NULL &&
							tmp->playingSound->sound->category == categoryIndex &&
							/*FIXME: tmp->playingSound->volume < limitmax.maxf &&*/
							!(tmp->state & (FACT_STATE_STOPPING | FACT_STATE_STOPPED))	)
						{
							wnr = tmp;
							/* limitmax.maxf = tmp->playingSound->volume; */
						}
						tmp = tmp->next;
					}
				}
				else if (category->maxInstanceBehavior == 4) /* Replace Lowest Priority */
				{
					limitmax.maxi = 0xFF;
					while (tmp != NULL)
					{
						if (	tmp != cue &&
							tmp->playingSound != NULL &&
							tmp->playingSound->sound->category == categoryIndex &&
							tmp->playingSound->sound->priority < limitmax.maxi &&
							!(tmp->state & (FACT_STATE_STOPPING | FACT_STATE_STOPPED))	)
						{
							wnr = tmp;
							limitmax.maxi = tmp->playingSound->sound->priority;
						}
						tmp = tmp->next;
					}
				}
				if (wnr != NULL)
				{
					fadeInMS = category->fadeInMS;
					if (wnr->playingSound != NULL)
					{
						FACT_INTERNAL_BeginFadeOut(wnr->playingSound, category->fadeOutMS);
					}
					else
					{
						FACTCue_Stop(wnr, 0);
					}
				}
			}
			category->instanceCount += 1;
		}

		newSound = (FACTSoundInstance*) cue->parentBank->parentEngine->pMalloc(
			sizeof(FACTSoundInstance)
		);
		newSound->parentCue = cue;
		newSound->sound = baseSound;
		newSound->rpcData.rpcVolume = 0.0f;
		newSound->rpcData.rpcPitch = 0.0f;
		newSound->rpcData.rpcReverbSend = 0.0f;
		newSound->rpcData.rpcFilterQFactor = FAUDIO_DEFAULT_FILTER_ONEOVERQ;
		newSound->rpcData.rpcFilterFreq = FAUDIO_DEFAULT_FILTER_FREQUENCY;
		newSound->fadeType = (fadeInMS > 0);
		if (newSound->fadeType)
		{
			newSound->fadeStart = FAudio_timems();
			newSound->fadeTarget = fadeInMS;
		}
		else
		{
			newSound->fadeStart = 0;
			newSound->fadeTarget = 0;
		}
		newSound->tracks = (FACTTrackInstance*) cue->parentBank->parentEngine->pMalloc(
			sizeof(FACTTrackInstance) * newSound->sound->trackCount
		);
		for (i = 0; i < newSound->sound->trackCount; i += 1)
		{
			newSound->tracks[i].rpcData.rpcVolume = 0.0f;
			newSound->tracks[i].rpcData.rpcPitch = 0.0f;
			newSound->tracks[i].rpcData.rpcReverbSend = 0.0f;
			newSound->tracks[i].rpcData.rpcFilterQFactor = FAUDIO_DEFAULT_FILTER_ONEOVERQ;
			newSound->tracks[i].rpcData.rpcFilterFreq = FAUDIO_DEFAULT_FILTER_FREQUENCY;

			newSound->tracks[i].evtVolume = 0.0f;
			newSound->tracks[i].evtPitch = 0.0f;

			newSound->tracks[i].activeWave.wave = NULL;
			newSound->tracks[i].activeWave.baseVolume = 0.0f;
			newSound->tracks[i].activeWave.basePitch = 0;
			newSound->tracks[i].activeWave.baseQFactor = FAUDIO_DEFAULT_FILTER_ONEOVERQ;
			newSound->tracks[i].activeWave.baseFrequency = FAUDIO_DEFAULT_FILTER_FREQUENCY;
			newSound->tracks[i].upcomingWave.wave = NULL;
			newSound->tracks[i].upcomingWave.baseVolume = 0.0f;
			newSound->tracks[i].upcomingWave.basePitch = 0;
			newSound->tracks[i].upcomingWave.baseQFactor = FAUDIO_DEFAULT_FILTER_ONEOVERQ;
			newSound->tracks[i].upcomingWave.baseFrequency = FAUDIO_DEFAULT_FILTER_FREQUENCY;

			newSound->tracks[i].events = (FACTEventInstance*) cue->parentBank->parentEngine->pMalloc(
				sizeof(FACTEventInstance) * newSound->sound->tracks[i].eventCount
			);
			for (j = 0; j < newSound->sound->tracks[i].eventCount; j += 1)
			{
				evt = &newSound->sound->tracks[i].events[j];

				newSound->tracks[i].events[j].timestamp =
					newSound->sound->tracks[i].events[j].timestamp;
				newSound->tracks[i].events[j].loopCount = 0;
				newSound->tracks[i].events[j].finished = 0;
				newSound->tracks[i].events[j].value = 0.0f;

				if (	evt->type == FACTEVENT_PLAYWAVE ||
					evt->type == FACTEVENT_PLAYWAVETRACKVARIATION ||
					evt->type == FACTEVENT_PLAYWAVEEFFECTVARIATION ||
					evt->type == FACTEVENT_PLAYWAVETRACKEFFECTVARIATION	)
				{
					newSound->tracks[i].events[j].loopCount =
						newSound->sound->tracks[i].events[j].wave.loopCount;

					evtInst = &newSound->tracks[i].events[j];
					if (	!evt->wave.isComplex ||
						(evt->wave.complex.variation & 0xF) == 0	)
					{
						evtInst->valuei = 0;
					}
					else
					{
						max = 0.0f;
						for (k = 0; k < evt->wave.complex.trackCount; k += 1)
						{
							max += evt->wave.complex.weights[k];
						}
						next = FACT_INTERNAL_rng() * max;
						for (k = evt->wave.complex.trackCount - 1; k >= 0; k -= 1)
						{
							if (next > (max - evt->wave.complex.weights[k]))
							{
								evtInst->valuei = k;
								break;
							}
							max -= evt->wave.complex.weights[k];
						}
					}
					FACT_INTERNAL_GetNextWave(
						cue,
						newSound->sound,
						&newSound->sound->tracks[i],
						&newSound->tracks[i],
						evt,
						evtInst
					);
					newSound->tracks[i].waveEvt = evt;
					newSound->tracks[i].waveEvtInst = evtInst;
				}
				else if (	evt->type == FACTEVENT_PITCHREPEATING ||
						evt->type == FACTEVENT_VOLUMEREPEATING	)
				{
					newSound->tracks[i].events[j].loopCount =
						newSound->sound->tracks[i].events[j].value.repeats;
				}
				else if (evt->type == FACTEVENT_MARKERREPEATING)
				{
					newSound->tracks[i].events[j].loopCount =
						newSound->sound->tracks[i].events[j].marker.repeats;
				}
			}
		}

		/* Calculate Max RPC Release Time */
		cue->maxRpcReleaseTime = 0;
		for (i = 0; i < newSound->sound->trackCount; i += 1)
		{
			for (j = 0; j < newSound->sound->tracks[i].rpcCodeCount; j += 1)
			{
				rpc = FACT_INTERNAL_GetRPC(
					newSound->parentCue->parentBank->parentEngine,
					newSound->sound->tracks[i].rpcCodes[j]
				);
				if (	rpc->parameter == RPC_PARAMETER_VOLUME &&
					cue->parentBank->parentEngine->variables[rpc->variable].accessibility & 0x04	)
				{
					if (FAudio_strcmp(
						newSound->parentCue->parentBank->parentEngine->variableNames[rpc->variable],
						"ReleaseTime"
					) == 0) {
						lastX = rpc->points[rpc->pointCount - 1].x;
						if (lastX > cue->maxRpcReleaseTime)
						{
							cue->maxRpcReleaseTime = (uint32_t) lastX /* bleh */;
						}
					}
				}
			}
		}

		cue->playingSound = newSound;
	}

	return 1;
}